

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::PhraseTests_ExtraPoints_Test::TestBody(PhraseTests_ExtraPoints_Test *this)

{
  optional<jhu::thrax::Span> oVar1;
  char *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  string_view sv;
  AssertHelper local_70;
  AssertionResult gtest_ar_;
  optional<jhu::thrax::Span> tgt;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  Alignment a;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)"0-0 0-4 2-4 3-3";
  readAlignment(&a,(thrax *)0xf,sv);
  oVar1 = minimalTargetSpan(&a,(Span)0x10000);
  tgt.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::Span>._M_payload =
       oVar1.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
       super__Optional_payload_base<jhu::thrax::Span>._M_payload;
  tgt.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::Span>._4_2_ =
       oVar1.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
       super__Optional_payload_base<jhu::thrax::Span>._4_2_;
  this_00 = &gtest_ar_.message_;
  gtest_ar_.success_ =
       oVar1.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
       super__Optional_payload_base<jhu::thrax::Span>._M_engaged;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (((uint6)oVar1.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
              super__Optional_payload_base<jhu::thrax::Span> & 0x100000000) == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"tgt.has_value()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x1a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,short>
              ((internal *)&gtest_ar,"0","tgt->start",(int *)&gtest_ar_,(short *)&tgt);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,short>
              ((internal *)&gtest_ar,"5","tgt->end",(int *)&gtest_ar_,
               &tgt.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                super__Optional_payload_base<jhu::thrax::Span>._M_payload._M_value.end);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    this_00 = &gtest_ar.message_;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  std::_Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~_Vector_base
            (&a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>);
  return;
}

Assistant:

TEST(PhraseTests, ExtraPoints) {
  auto a = readAlignment("0-0 0-4 2-4 3-3");
  Span src{0, 1};
  auto tgt = minimalTargetSpan(a, src);
  ASSERT_TRUE(tgt.has_value());
  EXPECT_EQ(0, tgt->start);
  EXPECT_EQ(5, tgt->end);
}